

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void fmt::v5::internal::write_exponent<fmt::v5::internal::char_counter&>(int exp,char_counter *h)

{
  long lVar1;
  char_counter *in_RSI;
  int in_EDI;
  char *d_1;
  char *d;
  int local_4;
  
  if (in_EDI < 0) {
    char_counter::append(in_RSI,'-');
    local_4 = -in_EDI;
  }
  else {
    char_counter::append(in_RSI,'+');
    local_4 = in_EDI;
  }
  if (local_4 < 100) {
    char_counter::append(in_RSI,basic_data<void>::DIGITS[local_4 << 1]);
    char_counter::append(in_RSI,basic_data<void>::DIGITS[(long)(local_4 << 1) + 1]);
  }
  else {
    char_counter::append(in_RSI,(char)(local_4 / 100) + '0');
    lVar1 = (long)(local_4 % 100 << 1);
    char_counter::append(in_RSI,basic_data<void>::DIGITS[lVar1]);
    char_counter::append(in_RSI,basic_data<void>::DIGITS[lVar1 + 1]);
  }
  return;
}

Assistant:

FMT_FUNC void write_exponent(int exp, Handler &&h) {
  FMT_ASSERT(-1000 < exp && exp < 1000, "exponent out of range");
  if (exp < 0) {
    h.append('-');
    exp = -exp;
  } else {
    h.append('+');
  }
  if (exp >= 100) {
    h.append(static_cast<char>('0' + exp / 100));
    exp %= 100;
    const char *d = data::DIGITS + exp * 2;
    h.append(d[0]);
    h.append(d[1]);
  } else {
    const char *d = data::DIGITS + exp * 2;
    h.append(d[0]);
    h.append(d[1]);
  }
}